

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O2

void zlsolve(int ldm,int ncol,doublecomplex *M,doublecomplex *rhs)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  int iVar8;
  doublecomplex *pdVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  doublecomplex *pdVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  lVar7 = (long)ldm;
  lVar13 = (long)(ldm * 4 + 4);
  pdVar9 = rhs + 2;
  pdVar10 = &M[2].i;
  lVar11 = 2;
  iVar8 = 4;
  pdVar16 = rhs;
  for (uVar12 = 0; (long)uVar12 < (long)(ncol + -3); uVar12 = uVar12 + 4) {
    dVar5 = rhs[uVar12].r;
    dVar6 = rhs[uVar12].i;
    dVar23 = -dVar6;
    dVar17 = rhs[uVar12 + 1].r - (M[1].r * dVar5 + M[1].i * dVar23);
    dVar18 = rhs[uVar12 + 1].i - (M[1].r * dVar6 + M[1].i * dVar5);
    dVar24 = -dVar18;
    dVar19 = (rhs[uVar12 + 2].r - (M[2].r * dVar5 + M[2].i * dVar23)) -
             (M[lVar7 + 2].r * dVar17 + M[lVar7 + 2].i * dVar24);
    dVar20 = (rhs[uVar12 + 2].i - (M[2].r * dVar6 + M[2].i * dVar5)) -
             (M[lVar7 + 2].r * dVar18 + M[lVar7 + 2].i * dVar17);
    dVar21 = ((rhs[uVar12 + 3].r - (M[3].r * dVar5 + M[3].i * dVar23)) -
             (M[lVar7 + 3].r * dVar17 + M[lVar7 + 3].i * dVar24)) -
             (M[lVar7 * 2 + 3].r * dVar19 + M[lVar7 * 2 + 3].i * -dVar20);
    dVar22 = ((rhs[uVar12 + 3].i - (M[3].r * dVar6 + M[3].i * dVar5)) -
             (M[lVar7 + 3].r * dVar18 + M[lVar7 + 3].i * dVar17)) -
             (M[lVar7 * 2 + 3].r * dVar20 + M[lVar7 * 2 + 3].i * dVar19);
    rhs[uVar12 + 1].r = dVar17;
    rhs[uVar12 + 1].i = dVar18;
    rhs[uVar12 + 2].r = dVar19;
    rhs[uVar12 + 2].i = dVar20;
    rhs[uVar12 + 3].r = dVar21;
    rhs[uVar12 + 3].i = dVar22;
    lVar15 = 0x40;
    for (iVar14 = iVar8; iVar14 < ncol; iVar14 = iVar14 + 1) {
      pdVar1 = (double *)((long)&M->r + lVar15);
      pdVar2 = (double *)((long)&pdVar16->r + lVar15);
      dVar25 = *pdVar2 - (*pdVar1 * dVar5 + pdVar1[1] * dVar23);
      dVar26 = pdVar2[1] - (*pdVar1 * dVar6 + pdVar1[1] * dVar5);
      pdVar2 = (double *)((long)&pdVar16->r + lVar15);
      *pdVar2 = dVar25;
      pdVar2[1] = dVar26;
      dVar25 = dVar25 - (pdVar1[lVar7 * 2] * dVar17 + pdVar1[lVar7 * 2 + 1] * dVar24);
      dVar26 = dVar26 - (pdVar1[lVar7 * 2] * dVar18 + pdVar1[lVar7 * 2 + 1] * dVar17);
      pdVar2 = (double *)((long)&pdVar16->r + lVar15);
      *pdVar2 = dVar25;
      pdVar2[1] = dVar26;
      dVar25 = dVar25 - (pdVar1[lVar7 * 4] * dVar19 + pdVar1[lVar7 * 4 + 1] * -dVar20);
      dVar26 = dVar26 - (pdVar1[lVar7 * 4] * dVar20 + pdVar1[lVar7 * 4 + 1] * dVar19);
      pdVar2 = (double *)((long)&pdVar16->r + lVar15);
      *pdVar2 = dVar25;
      pdVar2[1] = dVar26;
      dVar3 = pdVar1[lVar7 * 6];
      dVar4 = pdVar1[lVar7 * 6 + 1];
      pdVar1 = (double *)((long)&pdVar16->r + lVar15);
      *pdVar1 = dVar25 - (dVar3 * dVar21 + dVar4 * -dVar22);
      pdVar1[1] = dVar26 - (dVar3 * dVar22 + dVar4 * dVar21);
      lVar15 = lVar15 + 0x10;
    }
    M = M + lVar13;
    lVar11 = lVar11 + 4;
    pdVar9 = pdVar9 + 4;
    pdVar10 = pdVar10 + lVar13 * 2;
    pdVar16 = pdVar16 + 4;
    iVar8 = iVar8 + 4;
  }
  if ((int)uVar12 < ncol + -1) {
    uVar12 = uVar12 & 0xffffffff;
    dVar5 = rhs[uVar12].r;
    dVar6 = rhs[uVar12].i;
    dVar17 = rhs[uVar12 + 1].r - (M[1].r * dVar5 + M[1].i * -dVar6);
    dVar18 = rhs[uVar12 + 1].i - (M[1].r * dVar6 + M[1].i * dVar5);
    rhs[uVar12 + 1].r = dVar17;
    rhs[uVar12 + 1].i = dVar18;
    for (; lVar11 < ncol; lVar11 = lVar11 + 1) {
      dVar21 = pdVar9->r - (((doublecomplex *)(pdVar10 + -1))->r * dVar5 + *pdVar10 * -dVar6);
      dVar22 = pdVar9->i - (((doublecomplex *)(pdVar10 + -1))->r * dVar6 + *pdVar10 * dVar5);
      pdVar9->r = dVar21;
      pdVar9->i = dVar22;
      dVar19 = pdVar10[lVar7 * 2 + -1];
      dVar20 = pdVar10[lVar7 * 2];
      pdVar9->r = dVar21 - (dVar19 * dVar17 + dVar20 * -dVar18);
      pdVar9->i = dVar22 - (dVar19 * dVar18 + dVar20 * dVar17);
      pdVar9 = pdVar9 + 1;
      pdVar10 = pdVar10 + 2;
    }
  }
  return;
}

Assistant:

void zlsolve ( int ldm, int ncol, doublecomplex *M, doublecomplex *rhs )
{
    int k;
    doublecomplex x0, x1, x2, x3, temp;
    doublecomplex *M0;
    doublecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;

    M0 = &M[0];


    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      	Mki0 = M0 + 1;
      	Mki1 = Mki0 + ldm + 1;
      	Mki2 = Mki1 + ldm + 1;
      	Mki3 = Mki2 + ldm + 1;

      	x0 = rhs[firstcol];
      	zz_mult(&temp, &x0, Mki0); Mki0++;
      	z_sub(&x1, &rhs[firstcol+1], &temp);
      	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x2, &rhs[firstcol+2], &temp);
	zz_mult(&temp, &x1, Mki1); Mki1++;
	z_sub(&x2, &x2, &temp);
      	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x3, &rhs[firstcol+3], &temp);
	zz_mult(&temp, &x1, Mki1); Mki1++;
	z_sub(&x3, &x3, &temp);
	zz_mult(&temp, &x2, Mki2); Mki2++;
	z_sub(&x3, &x3, &temp);

 	rhs[++firstcol] = x1;
      	rhs[++firstcol] = x2;
      	rhs[++firstcol] = x3;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    zz_mult(&temp, &x0, Mki0); Mki0++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x1, Mki1); Mki1++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x2, Mki2); Mki2++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x3, Mki3); Mki3++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	}

        M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
        Mki0 = M0 + 1;
        Mki1 = Mki0 + ldm + 1;

        x0 = rhs[firstcol];
	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x1, &rhs[firstcol+1], &temp);

      	rhs[++firstcol] = x1;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    zz_mult(&temp, &x0, Mki0); Mki0++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x1, Mki1); Mki1++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	} 
    }
    
}